

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

weekday absl::lts_20250127::time_internal::cctz::detail::get_weekday(civil_second *cs)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = (long)(cs->f_).m;
  uVar1 = ((cs->f_).y % 400 - (ulong)(lVar2 < 3)) + 0x960;
  return *(weekday *)
          (&DAT_003c87d8 +
          ((long)(uVar1 / 400 + (uVar1 >> 2) +
                  (long)(cs->f_).d + (long)*(int *)(&DAT_003c8800 + lVar2 * 4) +
                 (uVar1 - (uVar1 >> 2) / 0x19)) % 7) * 4);
}

Assistant:

CONSTEXPR_M int day() const noexcept { return f_.d; }